

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DylibBundler.cpp
# Opt level: O1

void collectSubDependencies(void)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  string original_path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  do {
    lVar2 = (long)deps.super__Vector_base<Dependency,_std::allocator<Dependency>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)deps.super__Vector_base<Dependency,_std::allocator<Dependency>_>._M_impl.
                  super__Vector_impl_data._M_start;
    if (lVar2 != 0) {
      lVar4 = (lVar2 >> 3) * -0x1111111111111111;
      lVar4 = lVar4 + (ulong)(lVar4 == 0);
      lVar3 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,".",1);
        fflush(_stdout);
        std::operator+(&local_70,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&((deps.super__Vector_base<Dependency,_std::allocator<Dependency>_>.
                                 _M_impl.super__Vector_impl_data._M_start)->prefix)._M_dataplus._M_p
                       + lVar3),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&((deps.
                                           super__Vector_base<Dependency,_std::allocator<Dependency>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->filename).
                                         _M_dataplus._M_p + lVar3));
        bVar1 = isRpath(&local_70);
        if (bVar1) {
          searchFilenameInRpaths(&local_50,&local_70,&local_70);
          std::__cxx11::string::operator=((string *)&local_70,(string *)&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
        }
        collectDependencies(&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        lVar3 = lVar3 + 0x78;
        lVar4 = lVar4 + -1;
      } while (lVar4 != 0);
    }
  } while ((long)deps.super__Vector_base<Dependency,_std::allocator<Dependency>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)deps.super__Vector_base<Dependency,_std::allocator<Dependency>_>._M_impl.
                 super__Vector_impl_data._M_start != lVar2);
  return;
}

Assistant:

void collectSubDependencies()
{
    // print status to user
    size_t dep_amount = deps.size();
    
    // recursively collect each dependencie's dependencies
    while(true)
    {
        dep_amount = deps.size();
        for (size_t n=0; n<dep_amount; n++)
        {
            std::cout << "."; fflush(stdout);
            std::string original_path = deps[n].getOriginalPath();
            if (isRpath(original_path)) original_path = searchFilenameInRpaths(original_path);

            collectDependencies(original_path);
        }
        
        if(deps.size() == dep_amount) break; // no more dependencies were added on this iteration, stop searching
    }
}